

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::InstanceArrayPrimitive>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::InstanceArrayPrimitive>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  float fVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  FastAllocator *this_00;
  ThreadLocal *pTVar6;
  ThreadLocal2 *this_01;
  iterator __position;
  undefined8 *puVar7;
  undefined8 *puVar8;
  ulong uVar9;
  char *pcVar10;
  float *pfVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined1 local_58;
  ThreadLocal2 *local_50;
  char local_48;
  PrimRef *local_40;
  ThreadLocal2 *local_38;
  
  uVar4 = set->_begin;
  uVar5 = set->_end;
  uVar14 = uVar5 - uVar4;
  local_68 = (undefined8 *)(uVar14 * 8);
  this_00 = alloc->alloc;
  pTVar6 = alloc->talloc1;
  this_01 = pTVar6->parent;
  local_40 = prims;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_48 = '\x01';
    local_50 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_60 = &FastAllocator::s_thread_local_allocators_lock;
    local_58 = 1;
    local_38 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_38);
    }
    else {
      *__position._M_current = this_01;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_48 == '\x01') {
      MutexSys::unlock(&local_50->mutex);
    }
  }
  puVar8 = local_68;
  pTVar6->bytesUsed = pTVar6->bytesUsed + (long)local_68;
  sVar12 = pTVar6->cur;
  uVar13 = (ulong)(-(int)sVar12 & 0xf);
  uVar9 = (long)local_68 + uVar13 + sVar12;
  pTVar6->cur = uVar9;
  if (pTVar6->end < uVar9) {
    pTVar6->cur = sVar12;
    puVar7 = (undefined8 *)pTVar6->allocBlockSize;
    if ((undefined8 *)((long)local_68 * 4) < puVar7 || (long)local_68 * 4 - (long)puVar7 == 0) {
      local_60 = puVar7;
      pcVar10 = (char *)FastAllocator::malloc(this_00,(size_t)&local_60);
      pTVar6->ptr = pcVar10;
      sVar12 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
      pTVar6->bytesWasted = sVar12;
      pTVar6->end = (size_t)local_60;
      pTVar6->cur = (size_t)puVar8;
      if (local_60 < puVar8) {
        pTVar6->cur = 0;
        local_60 = (undefined8 *)pTVar6->allocBlockSize;
        pcVar10 = (char *)FastAllocator::malloc(this_00,(size_t)&local_60);
        pTVar6->ptr = pcVar10;
        sVar12 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar12;
        pTVar6->end = (size_t)local_60;
        pTVar6->cur = (size_t)puVar8;
        if (local_60 < puVar8) {
          pTVar6->cur = 0;
          pcVar10 = (char *)0x0;
          goto LAB_00c03bb9;
        }
      }
      pTVar6->bytesWasted = sVar12;
    }
    else {
      pcVar10 = (char *)FastAllocator::malloc(this_00,(size_t)&local_68);
    }
  }
  else {
    pTVar6->bytesWasted = pTVar6->bytesWasted + uVar13;
    pcVar10 = pTVar6->ptr + (uVar9 - (long)local_68);
  }
LAB_00c03bb9:
  if (uVar5 != uVar4) {
    pfVar11 = local_40[uVar4].upper.field_0.m128 + 3;
    uVar9 = 0;
    do {
      fVar3 = pfVar11[-4];
      *(float *)(pcVar10 + uVar9 * 8) = *pfVar11;
      *(float *)(pcVar10 + uVar9 * 8 + 4) = fVar3;
      uVar9 = uVar9 + 1;
      pfVar11 = pfVar11 + 8;
    } while (uVar14 != uVar9);
  }
  uVar9 = 7;
  if (uVar14 < 7) {
    uVar9 = uVar14;
  }
  return (NodeRef)(uVar9 | (ulong)pcVar10 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }